

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS ref_recon_max_jump_limit(REF_DBL *recon,REF_GRID ref_grid,REF_DBL max_jump)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  REF_DBL local_10d0;
  REF_DBL local_10c8;
  double local_10c0;
  double local_10b8;
  double local_10a8;
  double local_10a0;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL diag_system [12];
  REF_INT local_1008;
  REF_INT max_node;
  REF_INT node_list [1000];
  int local_5c;
  double dStack_58;
  REF_INT nnode;
  REF_DBL eig_ceiling;
  REF_DBL dist;
  REF_DBL radius;
  REF_INT node;
  REF_INT i;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL max_jump_local;
  REF_GRID ref_grid_local;
  REF_DBL *recon_local;
  
  ref_node = (REF_NODE)ref_grid->cell[8];
  _node = ref_grid->node;
  if (ref_grid->twod != 0) {
    ref_node = (REF_NODE)ref_grid->cell[3];
  }
  radius._0_4_ = 0;
  ref_cell = (REF_CELL)max_jump;
  max_jump_local = (REF_DBL)ref_grid;
  ref_grid_local = (REF_GRID)recon;
  do {
    if (_node->max <= radius._0_4_) {
      recon_local._4_4_ = ref_node_ghost_dbl(_node,(REF_DBL *)ref_grid_local,6);
      if (recon_local._4_4_ == 0) {
        recon_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x535,"ref_recon_max_jump_limit",(ulong)recon_local._4_4_,"update ghosts");
      }
      return recon_local._4_4_;
    }
    if (((-1 < radius._0_4_) && (radius._0_4_ < _node->max)) && (-1 < _node->global[radius._0_4_]))
    {
      uVar1 = ref_cell_node_list_around((REF_CELL)ref_node,radius._0_4_,1000,&local_5c,&local_1008);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x517,"ref_recon_max_jump_limit",(ulong)uVar1,"first halo of nodes");
        return uVar1;
      }
      dist = 0.0;
      for (radius._4_4_ = 0; radius._4_4_ < local_5c; radius._4_4_ = radius._4_4_ + 1) {
        dVar2 = pow(_node->real[(&local_1008)[radius._4_4_] * 0xf] - _node->real[radius._0_4_ * 0xf]
                    ,2.0);
        dVar3 = pow(_node->real[(&local_1008)[radius._4_4_] * 0xf + 1] -
                    _node->real[radius._0_4_ * 0xf + 1],2.0);
        dVar4 = pow(_node->real[(&local_1008)[radius._4_4_] * 0xf + 2] -
                    _node->real[radius._0_4_ * 0xf + 2],2.0);
        local_10a0 = sqrt(dVar2 + dVar3 + dVar4);
        eig_ceiling = local_10a0;
        if (radius._4_4_ == 0) {
          dist = local_10a0;
        }
        if (dist < local_10a0) {
          local_10a0 = dist;
        }
        dist = local_10a0;
      }
      if (dist * 1e+20 * dist <= 0.0) {
        local_10a8 = -(dist * 1e+20 * dist);
      }
      else {
        local_10a8 = dist * 1e+20 * dist;
      }
      if ((double)ref_cell * 4.0 <= 0.0) {
        local_10b8 = -((double)ref_cell * 4.0);
      }
      else {
        local_10b8 = (double)ref_cell * 4.0;
      }
      if (local_10b8 < local_10a8) {
        dStack_58 = ((double)ref_cell * 4.0) / (dist * dist);
        uVar1 = ref_matrix_diag_m((REF_DBL *)(ref_grid_local->cell + (long)(radius._0_4_ * 6) + -2),
                                  (REF_DBL *)&ref_private_macro_code_rss_1);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x52a,"ref_recon_max_jump_limit",(ulong)uVar1,"eigen decomp");
          return uVar1;
        }
        if (dStack_58 <= _ref_private_macro_code_rss_1) {
          local_10c0 = dStack_58;
        }
        else {
          local_10c0 = _ref_private_macro_code_rss_1;
        }
        _ref_private_macro_code_rss_1 = local_10c0;
        if (dStack_58 <= diag_system[0]) {
          local_10c8 = dStack_58;
        }
        else {
          local_10c8 = diag_system[0];
        }
        diag_system[0] = local_10c8;
        if (dStack_58 <= diag_system[1]) {
          local_10d0 = dStack_58;
        }
        else {
          local_10d0 = diag_system[1];
        }
        diag_system[1] = local_10d0;
        uVar1 = ref_matrix_form_m((REF_DBL *)&ref_private_macro_code_rss_1,
                                  (REF_DBL *)(ref_grid_local->cell + (long)(radius._0_4_ * 6) + -2))
        ;
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x531,"ref_recon_max_jump_limit",(ulong)uVar1,"re-form hess");
          return uVar1;
        }
      }
    }
    radius._0_4_ = radius._0_4_ + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_recon_max_jump_limit(REF_DBL *recon, REF_GRID ref_grid,
                                            REF_DBL max_jump) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node;
  REF_DBL radius, dist;
  REF_DBL eig_ceiling;
  REF_INT nnode, node_list[REF_RECON_MAX_DEGREE],
      max_node = REF_RECON_MAX_DEGREE;
  REF_DBL diag_system[12];

  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_tri(ref_grid);

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_cell_node_list_around(ref_cell, node, max_node, &nnode, node_list),
        "first halo of nodes");
    radius = 0.0;
    for (i = 0; i < nnode; i++) {
      dist = sqrt(pow(ref_node_xyz(ref_node, 0, node_list[i]) -
                          ref_node_xyz(ref_node, 0, node),
                      2) +
                  pow(ref_node_xyz(ref_node, 1, node_list[i]) -
                          ref_node_xyz(ref_node, 1, node),
                      2) +
                  pow(ref_node_xyz(ref_node, 2, node_list[i]) -
                          ref_node_xyz(ref_node, 2, node),
                      2));
      if (i == 0) radius = dist;
      radius = MIN(radius, dist);
    }
    /* 2nd order central finite difference */
    if (ref_math_divisible(4 * max_jump, radius * radius)) {
      eig_ceiling = (4 * max_jump) / (radius * radius);

      RSS(ref_matrix_diag_m(&(recon[6 * node]), diag_system), "eigen decomp");
      ref_matrix_eig(diag_system, 0) =
          MIN(ref_matrix_eig(diag_system, 0), eig_ceiling);
      ref_matrix_eig(diag_system, 1) =
          MIN(ref_matrix_eig(diag_system, 1), eig_ceiling);
      ref_matrix_eig(diag_system, 2) =
          MIN(ref_matrix_eig(diag_system, 2), eig_ceiling);
      RSS(ref_matrix_form_m(diag_system, &(recon[6 * node])), "re-form hess");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, recon, 6), "update ghosts");

  return REF_SUCCESS;
}